

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O0

curl_header * curl_easy_nextheader(CURL *easy,uint type,int request,curl_header *prev)

{
  int iVar1;
  Curl_header_store *n;
  void *pvVar2;
  Curl_header_store *hs_00;
  Curl_header_store *check;
  size_t index;
  size_t amount;
  Curl_header_store *hs;
  Curl_llist_node *e;
  Curl_llist_node *pick;
  Curl_easy *data;
  curl_header *prev_local;
  int request_local;
  uint type_local;
  CURL *easy_local;
  
  index = 0;
  check = (Curl_header_store *)0x0;
  if ((easy->state).requests < request) {
    easy_local = (CURL *)0x0;
  }
  else {
    prev_local._0_4_ = request;
    if (request == -1) {
      prev_local._0_4_ = (easy->state).requests;
    }
    if (prev == (curl_header *)0x0) {
      n = (Curl_header_store *)Curl_llist_head(&(easy->state).httphdrs);
    }
    else {
      if ((Curl_llist_node *)prev->anchor == (Curl_llist_node *)0x0) {
        return (curl_header *)0x0;
      }
      n = (Curl_header_store *)Curl_node_next((Curl_llist_node *)prev->anchor);
    }
    while ((n != (Curl_header_store *)0x0 &&
           ((pvVar2 = Curl_node_elem(&n->node), (*(byte *)((long)pvVar2 + 0x34) & type) == 0 ||
            (*(int *)((long)pvVar2 + 0x30) != (int)prev_local))))) {
      n = (Curl_header_store *)Curl_node_next(&n->node);
    }
    if (n == (Curl_header_store *)0x0) {
      easy_local = (CURL *)0x0;
    }
    else {
      hs_00 = (Curl_header_store *)Curl_node_elem(&n->node);
      for (hs = (Curl_header_store *)Curl_llist_head(&(easy->state).httphdrs);
          hs != (Curl_header_store *)0x0; hs = (Curl_header_store *)Curl_node_next(&hs->node)) {
        pvVar2 = Curl_node_elem(&hs->node);
        iVar1 = curl_strequal(hs_00->name,*(char **)((long)pvVar2 + 0x20));
        if (((iVar1 != 0) && (*(int *)((long)pvVar2 + 0x30) == (int)prev_local)) &&
           ((*(byte *)((long)pvVar2 + 0x34) & type) != 0)) {
          index = index + 1;
        }
        if (hs == n) {
          check = (Curl_header_store *)(index - 1);
        }
      }
      copy_header_external(hs_00,(size_t)check,index,&n->node,(easy->state).headerout + 1);
      easy_local = (CURL *)((easy->state).headerout + 1);
    }
  }
  return (curl_header *)easy_local;
}

Assistant:

struct curl_header *curl_easy_nextheader(CURL *easy,
                                         unsigned int type,
                                         int request,
                                         struct curl_header *prev)
{
  struct Curl_easy *data = easy;
  struct Curl_llist_node *pick;
  struct Curl_llist_node *e;
  struct Curl_header_store *hs;
  size_t amount = 0;
  size_t index = 0;

  if(request > data->state.requests)
    return NULL;
  if(request == -1)
    request = data->state.requests;

  if(prev) {
    pick = prev->anchor;
    if(!pick)
      /* something is wrong */
      return NULL;
    pick = Curl_node_next(pick);
  }
  else
    pick = Curl_llist_head(&data->state.httphdrs);

  if(pick) {
    /* make sure it is the next header of the desired type */
    do {
      hs = Curl_node_elem(pick);
      if((hs->type & type) && (hs->request == request))
        break;
      pick = Curl_node_next(pick);
    } while(pick);
  }

  if(!pick)
    /* no more headers available */
    return NULL;

  hs = Curl_node_elem(pick);

  /* count number of occurrences of this name within the mask and figure out
     the index for the currently selected entry */
  for(e = Curl_llist_head(&data->state.httphdrs); e; e = Curl_node_next(e)) {
    struct Curl_header_store *check = Curl_node_elem(e);
    if(strcasecompare(hs->name, check->name) &&
       (check->request == request) &&
       (check->type & type))
      amount++;
    if(e == pick)
      index = amount - 1;
  }

  copy_header_external(hs, index, amount, pick,
                       &data->state.headerout[1]);
  return &data->state.headerout[1];
}